

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::Bound_Function::build_param_type_info
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  int iVar1;
  element_type *peVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  long lVar6;
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_69;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_68;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  Type_Info local_48;
  
  peVar2 = (t_f->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  iVar1 = peVar2->m_arity;
  local_68 = __return_storage_ptr__;
  if (iVar1 < 0) {
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (iVar1 != (int)((ulong)((long)(t_args->
                                     super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(t_args->
                                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      __assert_fail("t_f->get_arity() < 0 || t_f->get_arity() == static_cast<int>(t_args.size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/proxy_functions.hpp"
                    ,0x1e3,
                    "static std::vector<Type_Info> chaiscript::dispatch::Bound_Function::build_param_type_info(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                   );
    }
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (&types,&peVar2->m_types);
    if (((long)types.
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)types.
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x18 !=
        ((long)(t_args->
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(t_args->
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               )._M_impl.super__Vector_impl_data._M_start >> 4) + 1) {
      __assert_fail("types.size() == t_args.size() + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/proxy_functions.hpp"
                    ,0x1ea,
                    "static std::vector<Type_Info> chaiscript::dispatch::Bound_Function::build_param_type_info(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                   );
    }
    local_48.m_flags =
         (types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
          _M_impl.super__Vector_impl_data._M_start)->m_flags;
    local_48.m_type_info =
         (types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
          _M_impl.super__Vector_impl_data._M_start)->m_type_info;
    local_48.m_bare_type_info =
         (types.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
          _M_impl.super__Vector_impl_data._M_start)->m_bare_type_info;
    __l._M_len = 1;
    __l._M_array = &local_48;
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__,__l,&local_69);
    lVar6 = 0;
    lVar5 = 0x18;
    for (uVar4 = 0;
        uVar4 < ((long)types.
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)types.
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U; uVar4 = uVar4 + 1) {
      local_48.m_type_info = (type_info *)&Placeholder_Object::typeinfo;
      local_48.m_bare_type_info = (type_info *)&Placeholder_Object::typeinfo;
      local_48.m_flags = 0;
      bVar3 = Type_Info::operator==
                        (*(Type_Info **)
                          ((long)&(((t_args->
                                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->m_data).
                                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar6),&local_48);
      if (bVar3) {
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::push_back
                  (local_68,(value_type *)
                            ((long)&(types.
                                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar5
                            ));
      }
      lVar5 = lVar5 + 0x18;
      lVar6 = lVar6 + 0x10;
    }
    std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
              (&types.
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>);
  }
  return local_68;
}

Assistant:

static std::vector<Type_Info> build_param_type_info(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args) {
        assert(t_f->get_arity() < 0 || t_f->get_arity() == static_cast<int>(t_args.size()));

        if (t_f->get_arity() < 0) {
          return std::vector<Type_Info>();
        }

        const auto types = t_f->get_param_types();
        assert(types.size() == t_args.size() + 1);

        // this analysis warning is invalid in MSVC12 and doesn't exist in MSVC14
        std::vector<Type_Info> retval{types[0]};

        for (size_t i = 0; i < types.size() - 1; ++i) {
          if (t_args[i].get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get()) {
            retval.push_back(types[i + 1]);
          }
        }

        return retval;
      }